

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChConstraintThree.cpp
# Opt level: O3

void __thiscall
chrono::ChConstraintThree::ArchiveOUT(ChConstraintThree *this,ChArchiveOut *marchive)

{
  ChArchiveOut::VersionWrite<chrono::ChConstraintThree>(marchive);
  ChConstraint::ArchiveOUT(&this->super_ChConstraint,marchive);
  return;
}

Assistant:

void ChConstraintThree::ArchiveOUT(ChArchiveOut& marchive) {
    // version number
    marchive.VersionWrite<ChConstraintThree>();

    // serialize the parent class data too
    ChConstraint::ArchiveOUT(marchive);

    // serialize all member data:
    // NOTHING INTERESTING TO SERIALIZE (pointers to variables must be rebound in run-time.)
}